

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

acttab * acttab_alloc(void)

{
  acttab *__s;
  acttab *p;
  
  __s = (acttab *)calloc(1,0x30);
  if (__s == (acttab *)0x0) {
    fprintf(_stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(__s,0,0x30);
  return __s;
}

Assistant:

acttab *acttab_alloc(void){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  return p;
}